

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZWcompress.cpp
# Opt level: O1

void __thiscall LZWcompress::LZWcompress(LZWcompress *this,uchar *YUVdata,uint size)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  uint __len;
  ulong uVar3;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->YUVdata_n).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->YUVdata_n).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->YUVdata_n).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->encode_map)._M_t._M_impl.super__Rb_tree_header;
  (this->encode_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->encode_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->encode_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->encode_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->encode_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->decode_map)._M_t._M_impl.super__Rb_tree_header;
  (this->decode_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->decode_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->decode_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->decode_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->decode_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->lzw_encode_output).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lzw_encode_output).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lzw_encode_output).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lzw_decode_output).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lzw_decode_output).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lzw_decode_output).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (size != 0) {
    uVar3 = 0;
    do {
      bVar2 = YUVdata[uVar3];
      __len = 3 - (bVar2 < 100);
      if (bVar2 < 10) {
        __len = 1;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_50._M_dataplus._M_p,__len,(uint)bVar2);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,&local_50
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      uVar3 = uVar3 + 1;
    } while (size != uVar3);
  }
  return;
}

Assistant:

LZWcompress::LZWcompress(uchar * YUVdata, uint size){
	for(uint i = 0; i < size; i++){
		YUVdata_n.push_back(std::to_string(int(YUVdata[i])));
	}
}